

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QSet<QTabBar_*> __thiscall QDockAreaLayoutInfo::usedTabBars(QDockAreaLayoutInfo *this)

{
  ulong uVar1;
  QDockAreaLayoutInfo *in_RSI;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QTabBar *copy;
  QHashDummyValue local_39;
  QTabBar *local_38;
  Data *local_30;
  
  local_30 = *(Data **)(in_FS_OFFSET + 0x28);
  this->sep = (int *)0x0;
  if (in_RSI->tabbed == true) {
    updateTabBar(in_RSI);
    local_38 = in_RSI->tabBar;
    QHash<QTabBar*,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QTabBar*,QHashDummyValue> *)this,&stack0xffffffffffffffc8,&local_39);
  }
  uVar1 = (in_RSI->item_list).d.size;
  if (uVar1 != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      if (*(long *)((long)&((in_RSI->item_list).d.ptr)->widgetItem + lVar2) != 0) {
        usedTabBars((QDockAreaLayoutInfo *)&stack0xffffffffffffffc8);
        QSet<QTabBar_*>::unite((QSet<QTabBar_*> *)this,(QSet<QTabBar_*> *)&stack0xffffffffffffffc8);
        QHash<QTabBar_*,_QHashDummyValue>::~QHash
                  ((QHash<QTabBar_*,_QHashDummyValue> *)&stack0xffffffffffffffc8);
        uVar1 = (in_RSI->item_list).d.size;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x28;
    } while (uVar3 < uVar1);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSet<QTabBar_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QTabBar*> QDockAreaLayoutInfo::usedTabBars() const
{
    QSet<QTabBar*> result;

    if (tabbed) {
        updateTabBar();
        result.insert(tabBar);
    }

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.subinfo != nullptr)
            result += item.subinfo->usedTabBars();
    }

    return result;
}